

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buttons.cpp
# Opt level: O3

void __thiscall GPIO::Switch::triggered(Switch *this,uint gpio)

{
  bool bVar1;
  undefined8 in_RAX;
  long lVar2;
  long lVar3;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  bVar1 = DigitalIn::debounce(&this->m_pin);
  if (!bVar1) {
    return;
  }
  if ((this->m_pin).m_state == false) {
    if ((this->f_off).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_0010ad49;
    lVar2 = 0xa0;
    lVar3 = 0x88;
  }
  else {
    if ((this->f_on).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_0010ad49;
    lVar2 = 0x80;
    lVar3 = 0x68;
  }
  (**(code **)((long)&(this->super_InputDetect).super_ObjectBase._vptr_ObjectBase + lVar2))
            ((long)&(this->super_InputDetect).super_ObjectBase._vptr_ObjectBase + lVar3);
LAB_0010ad49:
  if ((this->f_switched).super__Function_base._M_manager != (_Manager_type)0x0) {
    uStack_18 = CONCAT17((this->m_pin).m_state,(undefined7)uStack_18);
    (*(this->f_switched)._M_invoker)((_Any_data *)&this->f_switched,(bool *)((long)&uStack_18 + 7));
  }
  return;
}

Assistant:

void Switch::triggered(unsigned int gpio)
{
    // check if this is really a new event, or still a bouncing switch

    if (!m_pin.triggered()) return;
    
    // now call the virtual functions to trigger some action

    switch (m_pin.get_state()) {
        case false:
            if (f_off) f_off();
            break;

        case true:
            if (f_on) f_on();
            break;
    }
    
    if (f_switched) f_switched(m_pin.get_state());
}